

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_tri_supported(REF_GEOM ref_geom,REF_INT *nodes,REF_BOOL *has_support)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS status;
  REF_INT geom;
  REF_INT id;
  REF_INT node;
  REF_BOOL *has_support_local;
  REF_INT *nodes_local;
  REF_GEOM ref_geom_local;
  
  *has_support = 0;
  geom = *nodes;
  status = nodes[3];
  _id = has_support;
  has_support_local = nodes;
  nodes_local = &ref_geom->n;
  ref_geom_local._4_4_ = ref_geom_find(ref_geom,geom,2,status,&ref_private_macro_code_rss);
  if (ref_geom_local._4_4_ == 5) {
    *_id = 0;
    ref_geom_local._4_4_ = 0;
  }
  else if (ref_geom_local._4_4_ == 0) {
    *_id = 1;
    ref_geom_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1b6,
           "ref_geom_tri_supported",(ulong)ref_geom_local._4_4_,"error testing geom support");
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_supported(REF_GEOM ref_geom, REF_INT *nodes,
                                          REF_BOOL *has_support) {
  REF_INT node, id, geom;
  REF_STATUS status;
  *has_support = REF_FALSE;

  node = nodes[0];
  id = nodes[3];
  status = ref_geom_find(ref_geom, node, REF_GEOM_FACE, id, &geom);
  if (REF_NOT_FOUND == status) { /* no geom support */
    *has_support = REF_FALSE;
    return REF_SUCCESS;
  }
  RSS(status, "error testing geom support");
  *has_support = REF_TRUE;
  return REF_SUCCESS;
}